

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O0

int gz_next4(xz_statep state,unsigned_long *ret)

{
  byte *pbVar1;
  int iVar2;
  z_stream *pzVar3;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  z_streamp strm;
  unsigned_long val;
  int ch;
  unsigned_long *ret_local;
  xz_statep state_local;
  
  pzVar3 = &state->zstrm;
  if ((state->zstrm).avail_in == 0) {
    iVar2 = xz_avail_zstrm(state);
    if (iVar2 != -1) goto LAB_00266260;
    local_3c = 0xffffffff;
  }
  else {
LAB_00266260:
    if ((state->zstrm).avail_in == 0) {
      local_40 = 0xffffffff;
    }
    else {
      (state->zstrm).avail_in = (state->zstrm).avail_in - 1;
      pbVar1 = pzVar3->next_in;
      pzVar3->next_in = pbVar1 + 1;
      local_40 = (uint)*pbVar1;
    }
    local_3c = local_40;
  }
  if ((state->zstrm).avail_in == 0) {
    iVar2 = xz_avail_zstrm(state);
    if (iVar2 != -1) goto LAB_002662c9;
    local_44 = 0xffffffff;
  }
  else {
LAB_002662c9:
    if ((state->zstrm).avail_in == 0) {
      local_48 = 0xffffffff;
    }
    else {
      (state->zstrm).avail_in = (state->zstrm).avail_in - 1;
      pbVar1 = pzVar3->next_in;
      pzVar3->next_in = pbVar1 + 1;
      local_48 = (uint)*pbVar1;
    }
    local_44 = local_48;
  }
  if ((state->zstrm).avail_in == 0) {
    iVar2 = xz_avail_zstrm(state);
    if (iVar2 != -1) goto LAB_00266339;
    local_4c = 0xffffffff;
  }
  else {
LAB_00266339:
    if ((state->zstrm).avail_in == 0) {
      local_50 = 0xffffffff;
    }
    else {
      (state->zstrm).avail_in = (state->zstrm).avail_in - 1;
      pbVar1 = pzVar3->next_in;
      pzVar3->next_in = pbVar1 + 1;
      local_50 = (uint)*pbVar1;
    }
    local_4c = local_50;
  }
  if ((state->zstrm).avail_in == 0) {
    iVar2 = xz_avail_zstrm(state);
    if (iVar2 == -1) {
      local_54 = 0xffffffff;
      goto LAB_002663e8;
    }
  }
  if ((state->zstrm).avail_in == 0) {
    local_58 = 0xffffffff;
  }
  else {
    (state->zstrm).avail_in = (state->zstrm).avail_in - 1;
    pbVar1 = pzVar3->next_in;
    pzVar3->next_in = pbVar1 + 1;
    local_58 = (uint)*pbVar1;
  }
  local_54 = local_58;
LAB_002663e8:
  if (local_54 == 0xffffffff) {
    state_local._4_4_ = -1;
  }
  else {
    *ret = (long)(int)local_54 * 0x1000000 +
           (long)(int)local_4c * 0x10000 + (ulong)(local_44 << 8) + (long)(int)local_3c;
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

static int
gz_next4(xz_statep state, unsigned long *ret)
{
    int ch;
    unsigned long val;
    z_streamp strm = &(state->zstrm);

    val = NEXTZ();
    val += (unsigned) NEXTZ() << 8;
    val += (unsigned long) NEXTZ() << 16;
    ch = NEXTZ();
    if (ch == -1)
        return -1;
    val += (unsigned long) ch << 24;
    *ret = val;
    return 0;
}